

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O2

void __thiscall
swrenderer::DrawColumnRevSubClampTranslatedPalCommand::Execute
          (DrawColumnRevSubClampTranslatedPalCommand *this,DrawerThread *thread)

{
  int iVar1;
  int iVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  uint32_t *puVar6;
  uint32_t *puVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  byte *pbVar11;
  uint uVar12;
  uint uVar13;
  
  puVar3 = (this->super_PalColumnCommand)._dest;
  iVar1 = (this->super_PalColumnCommand)._iscale;
  iVar10 = (this->super_PalColumnCommand)._texturefrac;
  iVar8 = DrawerThread::count_for_thread
                    (thread,(this->super_PalColumnCommand).super_DrawerCommand._dest_y,
                     *(int *)&(this->super_PalColumnCommand).super_DrawerCommand.field_0xc);
  if (0 < iVar8) {
    iVar2 = (this->super_PalColumnCommand)._pitch;
    iVar9 = DrawerThread::skipped_by_thread
                      (thread,(this->super_PalColumnCommand).super_DrawerCommand._dest_y);
    pbVar11 = puVar3 + iVar9 * iVar2;
    iVar9 = DrawerThread::skipped_by_thread
                      (thread,(this->super_PalColumnCommand).super_DrawerCommand._dest_y);
    iVar10 = iVar9 * iVar1 + iVar10;
    iVar9 = thread->num_cores;
    puVar3 = (this->super_PalColumnCommand)._translation;
    puVar4 = (this->super_PalColumnCommand)._colormap;
    puVar5 = (this->super_PalColumnCommand)._source;
    puVar6 = (this->super_PalColumnCommand)._srcblend;
    puVar7 = (this->super_PalColumnCommand)._destblend;
    do {
      uVar12 = (puVar7[*pbVar11] | 0x40100400) - puVar6[puVar4[puVar3[puVar5[iVar10 >> 0x10]]]];
      uVar13 = uVar12 & 0x40100400;
      uVar12 = uVar13 - (uVar13 >> 5) & uVar12 | 0x1f07c1f;
      *pbVar11 = RGB32k.All[uVar12 >> 0xf & uVar12];
      pbVar11 = pbVar11 + iVar9 * iVar2;
      iVar10 = iVar10 + iVar1 * iVar9;
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
  }
  return;
}

Assistant:

void DrawColumnRevSubClampTranslatedPalCommand::Execute(DrawerThread *thread)
	{
		int count;
		uint8_t *dest;
		fixed_t frac;
		fixed_t fracstep;

		count = _count;
		dest = _dest;

		fracstep = _iscale;
		frac = _texturefrac;

		count = thread->count_for_thread(_dest_y, count);
		if (count <= 0)
			return;

		int pitch = _pitch;
		dest = thread->dest_for_thread(_dest_y, pitch, dest);
		frac += fracstep * thread->skipped_by_thread(_dest_y);
		fracstep *= thread->num_cores;
		pitch *= thread->num_cores;

		const uint8_t *translation = _translation;
		const uint8_t *colormap = _colormap;
		const uint8_t *source = _source;
		uint32_t *fg2rgb = _srcblend;
		uint32_t *bg2rgb = _destblend;

		do
		{
			uint32_t a = (bg2rgb[*dest] | 0x40100400) - fg2rgb[colormap[translation[source[frac >> FRACBITS]]]];
			uint32_t b = a;

			b &= 0x40100400;
			b = b - (b >> 5);
			a &= b;
			a |= 0x01f07c1f;
			*dest = RGB32k.All[(a >> 15) & a];
			dest += pitch;
			frac += fracstep;
		} while (--count);
	}